

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O1

int Abc_ObjHasDupFanouts(Abc_Obj_t *pObj)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = (ulong)(pObj->vFanouts).nSize;
  if (0 < (long)uVar2) {
    piVar1 = (pObj->vFanouts).pArray;
    uVar3 = uVar2;
    piVar4 = piVar1;
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      if (uVar6 < uVar2) {
        uVar7 = 1;
        do {
          if (piVar1[uVar5] == piVar4[uVar7]) {
            return 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      piVar4 = piVar4 + 1;
      uVar3 = uVar3 - 1;
      uVar5 = uVar6;
    } while (uVar6 != uVar2);
  }
  return 0;
}

Assistant:

static inline int         Abc_ObjFanoutNum( Abc_Obj_t * pObj )       { return pObj->vFanouts.nSize;    }